

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureLayerAttachmentTest::MaxTextureLevels
          (TextureLayerAttachmentTest *this,GLenum texture_target)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 *puVar2;
  double dVar3;
  GLint max_texture_size;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  max_texture_size = 0x400;
  if ((texture_target != 0x806f) && (texture_target != 0x8c1a)) {
    if (texture_target == 0x9102) {
      return 1;
    }
    if (texture_target != 0x9009) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0;
      __cxa_throw(puVar2,&int::typeinfo,0);
    }
  }
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8073,&max_texture_size);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x4ae);
  dVar3 = ::log((double)max_texture_size);
  return (GLuint)(long)dVar3;
}

Assistant:

glw::GLuint TextureLayerAttachmentTest::MaxTextureLevels(glw::GLenum texture_target)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint max_texture_size = 1024 /* Specification default. */;

	switch (texture_target)
	{
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		return 1;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_CUBE_MAP_ARRAY:
	case GL_TEXTURE_3D:

		gl.getIntegerv(GL_MAX_3D_TEXTURE_SIZE, &max_texture_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

		return (glw::GLuint)std::log((double)max_texture_size);
	default:
		throw 0;
	}

	/* For compiler warnings only. */
	return 0;
}